

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O3

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_openBase
                   (uint8_t *pkE,uint8_t *skR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t ctlen,uint8_t *ct,uint8_t *o_pt)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  uint32_t uVar1;
  uint uVar2;
  uint64_t ctx_seq;
  uint8_t ctx_nonce [12];
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t ctx_key [32];
  uint8_t ctx_exporter [64];
  ulong local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined1 *local_a8;
  undefined4 *puStack_a0;
  ulong *puStack_98;
  uint8_t *puStack_90;
  undefined4 local_84;
  ulong local_80;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  undefined1 local_38 [32];
  
  local_a8 = local_78;
  local_78 = ZEXT1632(ZEXT816(0) << 0x40);
  puStack_a0 = &local_b8;
  local_b8 = 0;
  uStack_b4 = 0;
  local_b0 = 0;
  puStack_98 = &local_c0;
  local_c0 = 0;
  puStack_90 = local_58;
  local_58 = ZEXT1632(ZEXT816(0) << 0x40);
  o_ctx_00.ctx_nonce = (uint8_t *)puStack_a0;
  o_ctx_00.ctx_key = local_a8;
  o_ctx_00.ctx_seq = puStack_98;
  o_ctx_00.ctx_exporter = puStack_90;
  local_38 = local_78;
  uVar1 = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx_00,pkE,skR,infolen,info);
  uVar2 = 1;
  if (uVar1 == 0) {
    local_84 = local_b8;
    local_80 = (local_c0 >> 0x38 | (local_c0 & 0xff000000000000) >> 0x28 |
                (local_c0 & 0xff0000000000) >> 0x18 | (local_c0 & 0xff00000000) >> 8 |
                (local_c0 & 0xff000000) << 8 | (local_c0 & 0xff0000) << 0x18 |
                (local_c0 & 0xff00) << 0x28 | local_c0 << 0x38) ^ CONCAT44(local_b0,uStack_b4);
    uVar1 = Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt
                      (o_pt,ct,ctlen - 0x10,aad,aadlen,local_78,(uint8_t *)&local_84,
                       ct + ((ulong)ctlen - 0x10));
    uVar2 = (uint)(local_c0 == 0xffffffffffffffff || uVar1 != 0);
  }
  return uVar2;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_openBase(
  uint8_t *pkE,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t ctlen,
  uint8_t *ct,
  uint8_t *o_pt
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[64U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx, pkE, skR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = ct;
    uint8_t *tag = ct + ctlen - 16U;
    uint32_t
    res1 =
      Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt(o_pt,
        cipher,
        ctlen - 16U,
        aad,
        aadlen,
        o_ctx.ctx_key,
        nonce,
        tag);
    if (res1 == 0U)
    {
      uint64_t s1 = o_ctx.ctx_seq[0U];
      if (s1 == 18446744073709551615ULL)
      {
        return 1U;
      }
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}